

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Arcflow::count_max_rep
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Arcflow *this,
          vector<int,_std::allocator<int>_> *space,int i0,int sub_i0)

{
  bool bVar1;
  pointer pIVar2;
  pointer piVar3;
  int *piVar4;
  pointer piVar5;
  pointer pvVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  allocator_type local_45;
  int local_44;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_44 = sub_i0;
  local_38 = space;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)(this->inst).nsizes,&local_45);
  bVar1 = (this->inst).binary;
  pIVar2 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)i0;
  do {
    if ((this->inst).nsizes <= lVar11) {
      return __return_storage_ptr__;
    }
    uVar9 = 1;
    if ((bVar1 & 1U) == 0) {
      uVar9 = pIVar2[lVar11].demand;
    }
    uVar8 = uVar9 - local_44;
    if ((int)(uVar9 - local_44) < 1) {
      uVar8 = 0;
    }
    if (lVar11 != i0) {
      uVar8 = uVar9;
    }
    uVar10 = (ulong)uVar8;
    piVar3[lVar11] = uVar8;
    piVar12 = pIVar2[lVar11].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar4 = *(pointer *)
              ((long)&pIVar2[lVar11].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl +
              8);
    piVar5 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar6 = (this->weights).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (piVar12 == piVar4) break;
      uVar7 = (long)piVar5[*piVar12] /
              (long)*(int *)(*(long *)&pvVar6[lVar11].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + (long)*piVar12 * 4);
      if ((int)uVar7 < (int)uVar10) {
        uVar10 = uVar7 & 0xffffffff;
      }
      piVar3[lVar11] = (int)uVar10;
      piVar12 = piVar12 + 1;
    } while ((int)uVar10 != 0);
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

std::vector<int> Arcflow::count_max_rep(const std::vector<int> &space, int i0 = 0,
										int sub_i0 = 0) const {
	std::vector<int> r(inst.nsizes);
	for (int i = i0; i < inst.nsizes; i++) {
		int dem = inst.binary ? 1 : sitems[i].demand;
		r[i] = i != i0 ? dem : std::max(0, dem - sub_i0);
		for (int d : sitems[i].nonzero) {
			r[i] = std::min(r[i], space[d] / weights[i][d]);
			if (!r[i]) {
				break;
			}
		}
	}
	return r;
}